

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmsh_file_v2.cc
# Opt level: O0

size_type_conflict lf::io::NumNodes(ElementType et)

{
  runtime_error *this;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  stringstream local_198 [8];
  stringstream ss;
  ostream local_188 [376];
  ElementType local_10;
  size_type_conflict local_c;
  ElementType et_local;
  
  switch(et) {
  case EDGE2:
    local_c = 2;
    break;
  case TRIA3:
    local_c = 3;
    break;
  case QUAD4:
  case TET4:
    local_c = 4;
    break;
  case HEX8:
    local_c = 8;
    break;
  case PRISM6:
    local_c = 6;
    break;
  case PYRAMID5:
    local_c = 5;
    break;
  case EDGE3:
    local_c = 3;
    break;
  case TRIA6:
    local_c = 6;
    break;
  case QUAD9:
    local_c = 9;
    break;
  case TET10:
    local_c = 10;
    break;
  case HEX27:
    local_c = 0x1b;
    break;
  case PRISM18:
    local_c = 0x12;
    break;
  case PYRAMID14:
    local_c = 0xe;
    break;
  case POINT:
    local_c = 1;
    break;
  case QUAD8:
    local_c = 8;
    break;
  case HEX20:
    local_c = 0x14;
    break;
  case PRISM15:
    local_c = 0xf;
    break;
  case PYRAMID13:
    local_c = 0xd;
    break;
  case TRIA9:
    local_c = 9;
    break;
  case TRIA10:
    local_c = 10;
    break;
  case TRIA12:
    local_c = 0xc;
    break;
  case TRIA15:
  case TRIA15_5:
    local_c = 0xf;
    break;
  case TRIA21:
    local_c = 0x15;
    break;
  case EDGE4:
    local_c = 4;
    break;
  case EDGE5:
    local_c = 5;
    break;
  case EDGE6:
    local_c = 6;
    break;
  case TET20:
    local_c = 0x14;
    break;
  case TET35:
    local_c = 0x23;
    break;
  case TET56:
    local_c = 0x38;
    break;
  default:
    local_10 = et;
    std::__cxx11::stringstream::stringstream(local_198);
    std::operator<<(local_188,"unknown Gmsh element type");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"false",&local_1c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_file_v2.cc"
               ,&local_1f1);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1c8,&local_1f0,0x102,&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::allocator<char>::~allocator(&local_1f1);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator(&local_1c9);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"this code should not be reached");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case HEX64:
    local_c = 0x40;
    break;
  case HEX125:
    local_c = 0x7d;
  }
  return local_c;
}

Assistant:

size_type NumNodes(GMshFileV2::ElementType et) {
  switch (et) {
    default:
      break;
    case GMshFileV2::ElementType::EDGE2:
      return 2;
    case GMshFileV2::ElementType::TRIA3:
      return 3;
    case GMshFileV2::ElementType::QUAD4:
    case GMshFileV2::ElementType::TET4:
      return 4;
    case GMshFileV2::ElementType::HEX8:
      return 8;
    case GMshFileV2::ElementType::PRISM6:
      return 6;
    case GMshFileV2::ElementType::PYRAMID5:
      return 5;
    case GMshFileV2::ElementType::EDGE3:
      return 3;
    case GMshFileV2::ElementType::TRIA6:
      return 6;
    case GMshFileV2::ElementType::QUAD9:
      return 9;
    case GMshFileV2::ElementType::TET10:
      return 10;
    case GMshFileV2::ElementType::HEX27:
      return 27;
    case GMshFileV2::ElementType::PRISM18:
      return 18;
    case GMshFileV2::ElementType::PYRAMID14:
      return 14;
    case GMshFileV2::ElementType::POINT:
      return 1;
    case GMshFileV2::ElementType::QUAD8:
      return 8;
    case GMshFileV2::ElementType::HEX20:
      return 20;
    case GMshFileV2::ElementType::PRISM15:
      return 15;
    case GMshFileV2::ElementType::PYRAMID13:
      return 13;
    case GMshFileV2::ElementType::TRIA9:
      return 9;
    case GMshFileV2::ElementType::TRIA10:
      return 10;
    case GMshFileV2::ElementType::TRIA12:
      return 12;
    case GMshFileV2::ElementType::TRIA15:
    case GMshFileV2::ElementType::TRIA15_5:
      return 15;
    case GMshFileV2::ElementType::TRIA21:
      return 21;
    case GMshFileV2::ElementType::EDGE4:
      return 4;
    case GMshFileV2::ElementType::EDGE5:
      return 5;
    case GMshFileV2::ElementType::EDGE6:
      return 6;
    case GMshFileV2::ElementType::TET20:
      return 20;
    case GMshFileV2::ElementType::TET35:
      return 35;
    case GMshFileV2::ElementType::TET56:
      return 56;
    case GMshFileV2::ElementType::HEX64:
      return 64;
    case GMshFileV2::ElementType::HEX125:
      return 125;
  }
  LF_VERIFY_MSG(false, "unknown Gmsh element type");
  // Make compiler happy:
  return 0;
}